

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Futex.cpp
# Opt level: O1

FutexResult
nativeFutexWaitImpl(void *addr,uint32_t expected,time_point *absSystemTime,time_point *absSteadyTime
                   ,uint32_t waitMask)

{
  int iVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  FutexResult FVar5;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong *puVar10;
  ulong local_18;
  long local_10;
  
  if (absSteadyTime != (time_point *)0x0 && absSystemTime != (time_point *)0x0) {
    __assert_fail("absSystemTime == nullptr || absSteadyTime == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/r10a[P]Event-Counts/Futex.cpp"
                  ,0x45,
                  "FutexResult nativeFutexWaitImpl(const void *, uint32_t, const system_clock::time_point *, const steady_clock::time_point *, uint32_t)"
                 );
  }
  if (absSystemTime == (time_point *)0x0) {
    if (absSteadyTime == (time_point *)0x0) {
      uVar9 = 0x89;
      puVar10 = (ulong *)0x0;
      goto LAB_0010235e;
    }
    uVar2 = (absSteadyTime->__d).__r;
    uVar8 = 0;
    if (0 < (long)uVar2) {
      uVar8 = uVar2;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar8;
    local_18 = SUB168(auVar4 * ZEXT816(0x112e0be826d694b3),8) >> 0x1a;
    local_10 = local_18 * -1000000000 + uVar8;
    uVar9 = 0x89;
  }
  else {
    uVar2 = (absSystemTime->__d).__r;
    uVar8 = 0;
    if (0 < (long)uVar2) {
      uVar8 = uVar2;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    local_18 = SUB168(auVar3 * ZEXT816(0x112e0be826d694b3),8) >> 0x1a;
    local_10 = local_18 * -1000000000 + uVar8;
    uVar9 = 0x189;
  }
  puVar10 = &local_18;
LAB_0010235e:
  lVar6 = syscall(0xca,addr,uVar9,(ulong)expected,puVar10,0,waitMask);
  if ((int)lVar6 == 0) {
    FVar5 = AWOKEN;
  }
  else {
    piVar7 = __errno_location();
    iVar1 = *piVar7;
    if (iVar1 == 4) {
      FVar5 = INTERRUPTED;
    }
    else if (iVar1 == 0xb) {
      FVar5 = VALUE_CHANGED;
    }
    else {
      if (iVar1 != 0x6e) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/r10a[P]Event-Counts/Futex.cpp"
                      ,0x6f,
                      "FutexResult nativeFutexWaitImpl(const void *, uint32_t, const system_clock::time_point *, const steady_clock::time_point *, uint32_t)"
                     );
      }
      FVar5 = TIMEDOUT;
      if (puVar10 == (ulong *)0x0) {
        __assert_fail("timeout != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/r10a[P]Event-Counts/Futex.cpp"
                      ,0x68,
                      "FutexResult nativeFutexWaitImpl(const void *, uint32_t, const system_clock::time_point *, const steady_clock::time_point *, uint32_t)"
                     );
      }
    }
  }
  return FVar5;
}

Assistant:

FutexResult nativeFutexWaitImpl(
        const void *addr,
        uint32_t expected,
        system_clock::time_point const *absSystemTime,
        steady_clock::time_point const *absSteadyTime,
        uint32_t waitMask) {
    assert(absSystemTime == nullptr || absSteadyTime == nullptr);

#ifndef PSHARED
    int op = FUTEX_WAIT_BITSET | FUTEX_PRIVATE_FLAG;
#else
    int op = FUTEX_WAIT_BITSET;
#endif
    struct timespec ts;
    struct timespec *timeout = nullptr;

    if (absSystemTime != nullptr) {
        op |= FUTEX_CLOCK_REALTIME;
        ts = timeSpecFromTimePoint(*absSystemTime);
        timeout = &ts;
    } else if (absSteadyTime != nullptr) {
        ts = timeSpecFromTimePoint(*absSteadyTime);
        timeout = &ts;
    }

    // Unlike FUTEX_WAIT, FUTEX_WAIT_BITSET requires an absolute timeout
    // value - http://locklessinc.com/articles/futex_cheat_sheet/
    int rv = syscall(
            __NR_futex,
            addr, /* addr1 */
            op, /* op */
            expected, /* val */
            timeout, /* timeout */
            nullptr, /* addr2 */
            waitMask); /* val3 */

    if (rv == 0) {
        return FutexResult::AWOKEN;
    } else {
        switch (errno) {
            case ETIMEDOUT:
                assert(timeout != nullptr);
                return FutexResult::TIMEDOUT;
            case EINTR:
                return FutexResult::INTERRUPTED;
            case EWOULDBLOCK:
                return FutexResult::VALUE_CHANGED;
            default:
                assert(false);
                // EINVAL, EACCESS, or EFAULT.  EINVAL means there was an invalid
                // op (should be impossible) or an invalid timeout (should have
                // been sanitized by timeSpecFromTimePoint).  EACCESS or EFAULT
                // means *addr points to invalid memory, which is unlikely because
                // the caller should have segfaulted already.  We can either
                // crash, or return a value that lets the process continue for
                // a bit. We choose the latter. VALUE_CHANGED probably turns the
                // caller into a spin lock.
                return FutexResult::VALUE_CHANGED;
        }
    }
}